

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_ordered.h
# Opt level: O1

pair<std::_List_iterator<std::pair<const_wasm::Literal,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>_>,_bool>
 __thiscall
wasm::
InsertOrderedMap<wasm::Literal,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>
::insert(InsertOrderedMap<wasm::Literal,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>
         *this,pair<const_wasm::Literal,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>
               *kv)

{
  size_t *psVar1;
  _Node *p_Var2;
  __hashtable *__h;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::Literal,_std::_List_iterator<std::pair<const_wasm::Literal,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>_>_>,_false,_true>,_bool>
  pVar3;
  pair<std::_List_iterator<std::pair<const_wasm::Literal,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>_>,_bool>
  pVar4;
  Literal local_50;
  list<std::pair<const_wasm::Literal,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>,_std::allocator<std::pair<const_wasm::Literal,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>_>_>
  *local_38;
  
  Literal::Literal(&local_50,&kv->first);
  local_38 = &this->List;
  pVar3 = std::
          _Hashtable<wasm::Literal,std::pair<wasm::Literal_const,std::_List_iterator<std::pair<wasm::Literal_const,std::vector<wasm::Expression**,std::allocator<wasm::Expression**>>>>>,std::allocator<std::pair<wasm::Literal_const,std::_List_iterator<std::pair<wasm::Literal_const,std::vector<wasm::Expression**,std::allocator<wasm::Expression**>>>>>>,std::__detail::_Select1st,std::equal_to<wasm::Literal>,std::hash<wasm::Literal>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_emplace<std::pair<wasm::Literal_const,std::_List_iterator<std::pair<wasm::Literal_const,std::vector<wasm::Expression**,std::allocator<wasm::Expression**>>>>>>
                    ((_Hashtable<wasm::Literal,std::pair<wasm::Literal_const,std::_List_iterator<std::pair<wasm::Literal_const,std::vector<wasm::Expression**,std::allocator<wasm::Expression**>>>>>,std::allocator<std::pair<wasm::Literal_const,std::_List_iterator<std::pair<wasm::Literal_const,std::vector<wasm::Expression**,std::allocator<wasm::Expression**>>>>>>,std::__detail::_Select1st,std::equal_to<wasm::Literal>,std::hash<wasm::Literal>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)this,&local_50);
  pVar4._8_4_ = pVar3._8_4_;
  Literal::~Literal(&local_50);
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    p_Var2 = std::__cxx11::
             list<std::pair<wasm::Literal_const,std::vector<wasm::Expression**,std::allocator<wasm::Expression**>>>,std::allocator<std::pair<wasm::Literal_const,std::vector<wasm::Expression**,std::allocator<wasm::Expression**>>>>>
             ::
             _M_create_node<std::pair<wasm::Literal_const,std::vector<wasm::Expression**,std::allocator<wasm::Expression**>>>const&>
                       ((list<std::pair<wasm::Literal_const,std::vector<wasm::Expression**,std::allocator<wasm::Expression**>>>,std::allocator<std::pair<wasm::Literal_const,std::vector<wasm::Expression**,std::allocator<wasm::Expression**>>>>>
                         *)&this->List,kv);
    std::__detail::_List_node_base::_M_hook(&p_Var2->super__List_node_base);
    psVar1 = &(this->List).
              super__List_base<std::pair<const_wasm::Literal,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>,_std::allocator<std::pair<const_wasm::Literal,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>_>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    *(_List_node_base **)
     ((long)pVar3.first.
            super__Node_iterator_base<std::pair<const_wasm::Literal,_std::_List_iterator<std::pair<const_wasm::Literal,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>_>_>,_true>
            ._M_cur.
            super__Node_iterator_base<std::pair<const_wasm::Literal,_std::_List_iterator<std::pair<const_wasm::Literal,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>_>_>,_true>
     + 0x20) = (this->List).
               super__List_base<std::pair<const_wasm::Literal,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>,_std::allocator<std::pair<const_wasm::Literal,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_prev;
  }
  pVar4.first._M_node =
       (_List_node_base *)
       *(undefined8 *)
        ((long)pVar3.first.
               super__Node_iterator_base<std::pair<const_wasm::Literal,_std::_List_iterator<std::pair<const_wasm::Literal,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>_>_>,_true>
               ._M_cur.
               super__Node_iterator_base<std::pair<const_wasm::Literal,_std::_List_iterator<std::pair<const_wasm::Literal,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>_>_>,_true>
        + 0x20);
  pVar4._12_4_ = 0;
  return pVar4;
}

Assistant:

std::pair<iterator, bool> insert(const std::pair<const Key, T>& kv) {
    // Try inserting with a placeholder list iterator.
    auto inserted = Map.insert({kv.first, List.end()});
    if (inserted.second) {
      // This is a new item; insert it in the list and update the iterator.
      List.push_back(kv);
      inserted.first->second = std::prev(List.end());
    }
    return {inserted.first->second, inserted.second};
  }